

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_A_ActiveSound
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  AActor *ent;
  char *__assertion;
  FSoundID local_c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0040193c;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0040193c;
        }
        goto LAB_004018fd;
      }
    }
    else if (ent != (AActor *)0x0) goto LAB_0040192c;
    ent = (AActor *)0x0;
LAB_004018fd:
    local_c.ID = (ent->ActiveSound).super_FSoundID.ID;
    if (local_c.ID != 0) {
      S_Sound(ent,2,&local_c,1.0,1.0);
    }
    return 0;
  }
LAB_0040192c:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0040193c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xc85,
                "int AF_AActor_A_ActiveSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ActiveSound)
{
	PARAM_SELF_PROLOGUE(AActor);
	if (self->ActiveSound)
	{
		S_Sound(self, CHAN_VOICE, self->ActiveSound, 1, ATTN_NORM);
	}
	return 0;
}